

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa.c
# Opt level: O3

exr_result_t
internal_exr_undo_dwab
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  exr_result_t eVar1;
  uint64_t newsz;
  exr_decode_pipeline_t *decode_00;
  DwaCompressor dwaa;
  DwaCompressor local_e8;
  
  decode_00 = (exr_decode_pipeline_t *)&decode->scratch_alloc_size_1;
  newsz = internal_exr_huf_decompress_spare_bytes();
  eVar1 = internal_decode_alloc_buffer
                    (decode,EXR_TRANSCODE_BUFFER_SCRATCH1,&decode->scratch_buffer_1,
                     (size_t *)decode_00,newsz);
  if (eVar1 == 0) {
    eVar1 = DwaCompressor_construct
                      (&local_e8,STATIC_HUFFMAN,(exr_encode_pipeline_t *)decode,decode_00);
    if (eVar1 == 0) {
      eVar1 = DwaCompressor_uncompress
                        (&local_e8,(uint8_t *)compressed_data,comp_buf_size,uncompressed_data,
                         uncompressed_size);
    }
    DwaCompressor_destroy(&local_e8);
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_dwab (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t  rv;
    DwaCompressor dwaa;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        internal_exr_huf_decompress_spare_bytes ());
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = DwaCompressor_construct (&dwaa, STATIC_HUFFMAN, NULL, decode);
        if (rv == EXR_ERR_SUCCESS)
            rv = DwaCompressor_uncompress (
                &dwaa,
                (const uint8_t*) compressed_data,
                comp_buf_size,
                uncompressed_data,
                uncompressed_size);

        DwaCompressor_destroy (&dwaa);
    }

    return rv;
}